

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ReleaseMessageTest_Test::TestBody
          (GeneratedMessageReflectionTest_ReleaseMessageTest_Test *this)

{
  Descriptor *base_descriptor;
  undefined1 local_3d0 [8];
  ReflectionTester reflection_tester;
  TestAllTypes message;
  GeneratedMessageReflectionTest_ReleaseMessageTest_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&reflection_tester.import_baz_);
  base_descriptor = proto2_unittest::TestAllTypes::descriptor();
  TestUtil::ReflectionTester::ReflectionTester((ReflectionTester *)local_3d0,base_descriptor);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_3d0,(Message *)&reflection_tester.import_baz_,IS_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            ((ReflectionTester *)local_3d0,(Message *)&reflection_tester.import_baz_);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_3d0,(Message *)&reflection_tester.import_baz_,NOT_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            ((ReflectionTester *)local_3d0,(Message *)&reflection_tester.import_baz_);
  proto2_unittest::TestAllTypes::Clear((TestAllTypes *)&reflection_tester.import_baz_);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_3d0,(Message *)&reflection_tester.import_baz_,CAN_BE_NULL);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)&reflection_tester.import_baz_);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)&reflection_tester.import_baz_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&reflection_tester.import_baz_);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ReleaseMessageTest) {
  unittest::TestAllTypes message;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllTypes::descriptor());

  // When nothing is set, we expect all released messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are set we should get non-nullptr releases.
  reflection_tester.SetAllFieldsViaReflection(&message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::NOT_NULL);

  // After Clear() we may or may not get a message from ReleaseMessage().
  // This is implementation specific.
  reflection_tester.SetAllFieldsViaReflection(&message);
  message.Clear();
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::CAN_BE_NULL);

  // Test a different code path for setting after releasing.
  TestUtil::SetAllFields(&message);
  TestUtil::ExpectAllFieldsSet(message);
}